

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_refinement.cpp
# Opt level: O1

void __thiscall duckdb::CSVSniffer::RefineTypes(CSVSniffer *this)

{
  vector<duckdb::LogicalType,_true> *pvVar1;
  size_type __n;
  pointer pLVar2;
  pointer pLVar3;
  undefined8 uVar4;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_00;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  pointer pSVar9;
  CSVStateMachine *pCVar10;
  mapped_type *pmVar11;
  reference pvVar12;
  undefined4 extraout_var;
  DataChunk *this_01;
  long lVar13;
  reference parse_chunk_col;
  LogicalType *pLVar14;
  pointer pLVar15;
  unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
  *puVar16;
  key_type local_b0;
  LogicalType local_a8;
  LogicalType local_90;
  unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
  *local_78;
  CSVStateMachine *local_70;
  ulong local_68;
  vector<duckdb::LogicalType,_true> *local_60;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_58;
  
  puVar16 = &this->best_candidate;
  pSVar9 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
           ::operator->(puVar16);
  pCVar10 = BaseScanner::GetStateMachine(&pSVar9->super_BaseScanner);
  pvVar1 = &this->detected_types;
  __n = (pCVar10->dialect_options).num_cols;
  LogicalType::LogicalType(&local_a8,VARCHAR);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_fill_assign
            (&pvVar1->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,__n,
             &local_a8);
  LogicalType::~LogicalType(&local_a8);
  if (pCVar10->options->all_varchar == false) {
    local_60 = pvVar1;
    if (1 < pCVar10->options->sample_size_chunks) {
      local_58 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&this->best_sql_types_candidates_per_column_idx;
      local_68 = 1;
      local_78 = puVar16;
      local_70 = pCVar10;
      do {
        puVar16 = local_78;
        pSVar9 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                 ::operator->(local_78);
        bVar5 = BaseScanner::FinishedFile(&pSVar9->super_BaseScanner);
        if (bVar5) {
          pLVar2 = (this->detected_types).
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pLVar3 = (this->detected_types).
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          pLVar15 = pLVar2;
          if (pLVar3 != pLVar2) {
            do {
              LogicalType::~LogicalType(pLVar15);
              pLVar15 = pLVar15 + 1;
            } while (pLVar15 != pLVar3);
            (this->detected_types).
            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_finish = pLVar2;
          }
          pvVar1 = local_60;
          pCVar10 = local_70;
          local_b0 = 0;
          if ((this->best_sql_types_candidates_per_column_idx)._M_h._M_element_count != 0) {
            do {
              this_00 = local_58;
              pmVar11 = ::std::__detail::
                        _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[](local_58,&local_b0);
              pvVar12 = vector<duckdb::LogicalType,_true>::back(pmVar11);
              LogicalType::LogicalType(&local_a8,pvVar12);
              pmVar11 = ::std::__detail::
                        _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[](this_00,&local_b0);
              if ((long)(pmVar11->
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pmVar11->
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_start ==
                  (long)(pCVar10->options->auto_type_candidates).
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pCVar10->options->auto_type_candidates).
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_start) {
                LogicalType::LogicalType(&local_90,VARCHAR);
                uVar4 = local_90._0_8_;
                local_a8.id_ = local_90.id_;
                local_a8.physical_type_ = local_90.physical_type_;
                local_90._0_8_ = uVar4;
                LogicalType::~LogicalType(&local_90);
              }
              ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                        (&pvVar1->
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                         &local_a8);
              LogicalType::~LogicalType(&local_a8);
              local_b0 = local_b0 + 1;
            } while (local_b0 <
                     (this->best_sql_types_candidates_per_column_idx)._M_h._M_element_count);
          }
        }
        else {
          pSVar9 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                   ::operator->(puVar16);
          iVar8 = (*(pSVar9->super_BaseScanner)._vptr_BaseScanner[2])(pSVar9);
          this_01 = StringValueResult::ToChunk((StringValueResult *)CONCAT44(extraout_var,iVar8));
          local_90.id_ = INVALID;
          local_90.physical_type_ = ~INVALID;
          local_90._2_6_ = 0;
          if ((this_01->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (this_01->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_start) {
LAB_0168160a:
            pmVar11 = ::std::__detail::
                      _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[](local_58,(key_type *)&local_90);
            pvVar12 = vector<duckdb::LogicalType,_true>::back(pmVar11);
            LogicalType::LogicalType(&local_a8,BOOLEAN);
            bVar6 = LogicalType::operator==(pvVar12,&local_a8);
            LogicalType::~LogicalType(&local_a8);
            lVar13 = (long)(pmVar11->
                           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pmVar11->
                           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            while (1 < (ulong)((lVar13 >> 3) * -0x5555555555555555)) {
              pvVar12 = vector<duckdb::LogicalType,_true>::back(pmVar11);
              parse_chunk_col =
                   vector<duckdb::Vector,_true>::operator[](&this_01->data,local_90._0_8_);
              bVar7 = TryCastVector(this,parse_chunk_col,this_01->count,pvVar12);
              if (bVar7) break;
              pvVar12 = vector<duckdb::LogicalType,_true>::back(pmVar11);
              LogicalType::LogicalType(&local_a8,BOOLEAN);
              bVar7 = LogicalType::operator==(pvVar12,&local_a8);
              LogicalType::~LogicalType(&local_a8);
              if (bVar7 && bVar6) goto LAB_0168171d;
              pLVar14 = (pmVar11->
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1;
              (pmVar11->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish = pLVar14;
              LogicalType::~LogicalType(pLVar14);
              lVar13 = (long)(pmVar11->
                             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                             ).
                             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pmVar11->
                             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                             ).
                             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                             ._M_impl.super__Vector_impl_data._M_start;
            }
            goto LAB_01681750;
          }
LAB_01681780:
          DataChunk::Reset(this_01);
          this_01->capacity = 0x800;
          pCVar10 = local_70;
        }
        if (bVar5) {
          return;
        }
        local_68 = local_68 + 1;
        puVar16 = local_78;
      } while (local_68 < pCVar10->options->sample_size_chunks);
    }
    pLVar2 = (this->detected_types).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start;
    pLVar3 = (this->detected_types).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pLVar15 = pLVar2;
    if (pLVar3 != pLVar2) {
      do {
        LogicalType::~LogicalType(pLVar15);
        pLVar15 = pLVar15 + 1;
      } while (pLVar15 != pLVar3);
      (this->detected_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
      .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish = pLVar2;
    }
    local_b0 = 0;
    if ((this->best_sql_types_candidates_per_column_idx)._M_h._M_element_count != 0) {
      do {
        pmVar11 = ::std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&this->best_sql_types_candidates_per_column_idx,&local_b0);
        pvVar12 = vector<duckdb::LogicalType,_true>::back(pmVar11);
        LogicalType::LogicalType(&local_a8,pvVar12);
        pmVar11 = ::std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&this->best_sql_types_candidates_per_column_idx,&local_b0);
        pLVar2 = (pmVar11->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        pLVar3 = (pmVar11->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pSVar9 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                 ::operator->(puVar16);
        pCVar10 = BaseScanner::GetStateMachine(&pSVar9->super_BaseScanner);
        if (((long)pLVar2 - (long)pLVar3 ==
             (long)(pCVar10->options->auto_type_candidates).
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pCVar10->options->auto_type_candidates).
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start) &&
           (this->default_null_to_varchar == true)) {
          LogicalType::LogicalType(&local_90,VARCHAR);
          uVar4 = local_90._0_8_;
          local_a8.id_ = local_90.id_;
          local_a8.physical_type_ = local_90.physical_type_;
          local_90._0_8_ = uVar4;
          LogicalType::~LogicalType(&local_90);
        }
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  (&local_60->
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                   &local_a8);
        LogicalType::~LogicalType(&local_a8);
        local_b0 = local_b0 + 1;
      } while (local_b0 < (this->best_sql_types_candidates_per_column_idx)._M_h._M_element_count);
    }
  }
  return;
LAB_0168171d:
  while( true ) {
    pvVar12 = vector<duckdb::LogicalType,_true>::back(pmVar11);
    LogicalType::LogicalType(&local_a8,VARCHAR);
    bVar6 = LogicalType::operator==(pvVar12,&local_a8);
    LogicalType::~LogicalType(&local_a8);
    if (bVar6) break;
    pLVar14 = (pmVar11->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish + -1;
    (pmVar11->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = pLVar14;
    LogicalType::~LogicalType(pLVar14);
  }
LAB_01681750:
  local_90._0_8_ = local_90._0_8_ + 1;
  if ((ulong)(((long)(this_01->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this_01->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5) <=
      (ulong)local_90._0_8_) goto LAB_01681780;
  goto LAB_0168160a;
}

Assistant:

void CSVSniffer::RefineTypes() {
	auto &sniffing_state_machine = best_candidate->GetStateMachine();
	// if data types were provided, exit here if number of columns does not match
	detected_types.assign(sniffing_state_machine.dialect_options.num_cols, LogicalType::VARCHAR);
	if (sniffing_state_machine.options.all_varchar) {
		// return all types varchar
		return;
	}
	for (idx_t i = 1; i < sniffing_state_machine.options.sample_size_chunks; i++) {
		bool finished_file = best_candidate->FinishedFile();
		if (finished_file) {
			// we finished the file: stop
			// set sql types
			detected_types.clear();
			for (idx_t column_idx = 0; column_idx < best_sql_types_candidates_per_column_idx.size(); column_idx++) {
				LogicalType d_type = best_sql_types_candidates_per_column_idx[column_idx].back();
				if (best_sql_types_candidates_per_column_idx[column_idx].size() ==
				    sniffing_state_machine.options.auto_type_candidates.size()) {
					d_type = LogicalType::VARCHAR;
				}
				detected_types.push_back(d_type);
			}
			return;
		}
		auto &parse_chunk = best_candidate->ParseChunk().ToChunk();

		for (idx_t col = 0; col < parse_chunk.ColumnCount(); col++) {
			vector<LogicalType> &col_type_candidates = best_sql_types_candidates_per_column_idx[col];
			bool is_bool_type = col_type_candidates.back() == LogicalType::BOOLEAN;
			while (col_type_candidates.size() > 1) {
				const auto &sql_type = col_type_candidates.back();
				if (TryCastVector(parse_chunk.data[col], parse_chunk.size(), sql_type)) {
					break;
				}
				if (col_type_candidates.back() == LogicalType::BOOLEAN && is_bool_type) {
					// If we thought this was a boolean value (i.e., T,F, True, False) and it is not, we
					// immediately pop to varchar.
					while (col_type_candidates.back() != LogicalType::VARCHAR) {
						col_type_candidates.pop_back();
					}
					break;
				}
				col_type_candidates.pop_back();
			}
		}
		// reset parse chunk for the next iteration
		parse_chunk.Reset();
		parse_chunk.SetCapacity(CSVReaderOptions::sniff_size);
	}
	detected_types.clear();
	// set sql types
	for (idx_t column_idx = 0; column_idx < best_sql_types_candidates_per_column_idx.size(); column_idx++) {
		LogicalType d_type = best_sql_types_candidates_per_column_idx[column_idx].back();
		if (best_sql_types_candidates_per_column_idx[column_idx].size() ==
		        best_candidate->GetStateMachine().options.auto_type_candidates.size() &&
		    default_null_to_varchar) {
			d_type = LogicalType::VARCHAR;
		}
		detected_types.push_back(d_type);
	}
}